

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall V1Transport::V1Transport(V1Transport *this,NodeId node_id)

{
  long lVar1;
  char *pszName;
  CChainParams *mutexIn;
  CMessageHeader *this_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock37;
  CChainParams *in_stack_ffffffffffffff98;
  CSerializedNetMsg *this_01;
  V1Transport *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Transport::Transport((Transport *)in_stack_ffffffffffffff98);
  *(undefined ***)in_RDI = &PTR__V1Transport_023c3a60;
  pszName = in_RDI + 8;
  mutexIn = Params();
  this_00 = (CMessageHeader *)CChainParams::MessageStart(in_stack_ffffffffffffff98);
  *(undefined4 *)pszName = *(undefined4 *)(this_00->pchMessageStart)._M_elems;
  *(UniqueLock<AnnotatedMixin<std::mutex>_> **)(in_RDI + 0x10) = in_RSI;
  AnnotatedMixin<std::mutex>::AnnotatedMixin
            ((AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff98);
  CHash256::CHash256((CHash256 *)in_stack_ffffffffffffff98);
  uint256::uint256((uint256 *)in_stack_ffffffffffffff98);
  this_01 = (CSerializedNetMsg *)0x0;
  in_RDI[0xe0] = '\0';
  in_RDI[0xe1] = '\0';
  in_RDI[0xe2] = '\0';
  in_RDI[0xe3] = '\0';
  in_RDI[0xe4] = '\0';
  in_RDI[0xe5] = '\0';
  in_RDI[0xe6] = '\0';
  in_RDI[0xe7] = '\0';
  in_RDI[0xe8] = '\0';
  in_RDI[0xe9] = '\0';
  in_RDI[0xea] = '\0';
  in_RDI[0xeb] = '\0';
  in_RDI[0xec] = '\0';
  in_RDI[0xed] = '\0';
  in_RDI[0xee] = '\0';
  in_RDI[0xef] = '\0';
  in_RDI[0xd0] = '\0';
  in_RDI[0xd1] = '\0';
  in_RDI[0xd2] = '\0';
  in_RDI[0xd3] = '\0';
  in_RDI[0xd4] = '\0';
  in_RDI[0xd5] = '\0';
  in_RDI[0xd6] = '\0';
  in_RDI[0xd7] = '\0';
  in_RDI[0xd8] = '\0';
  in_RDI[0xd9] = '\0';
  in_RDI[0xda] = '\0';
  in_RDI[0xdb] = '\0';
  in_RDI[0xdc] = '\0';
  in_RDI[0xdd] = '\0';
  in_RDI[0xde] = '\0';
  in_RDI[0xdf] = '\0';
  DataStream::DataStream((DataStream *)0x0);
  CMessageHeader::CMessageHeader(this_00);
  *(CSerializedNetMsg **)(in_RDI + 0x118) = this_01;
  in_RDI[0x120] = '\0';
  in_RDI[0x121] = '\0';
  in_RDI[0x122] = '\0';
  in_RDI[0x123] = '\0';
  in_RDI[0x124] = '\0';
  in_RDI[0x125] = '\0';
  in_RDI[0x126] = '\0';
  in_RDI[0x127] = '\0';
  *(CSerializedNetMsg **)(in_RDI + 0x108) = this_01;
  in_RDI[0x110] = '\0';
  in_RDI[0x111] = '\0';
  in_RDI[0x112] = '\0';
  in_RDI[0x113] = '\0';
  in_RDI[0x114] = '\0';
  in_RDI[0x115] = '\0';
  in_RDI[0x116] = '\0';
  in_RDI[0x117] = '\0';
  DataStream::DataStream((DataStream *)this_01);
  AnnotatedMixin<std::mutex>::AnnotatedMixin((AnnotatedMixin<std::mutex> *)this_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this_01->data);
  CSerializedNetMsg::CSerializedNetMsg(this_01);
  in_RDI[0x1a8] = '\0';
  in_RDI[0x1b0] = '\0';
  in_RDI[0x1b1] = '\0';
  in_RDI[0x1b2] = '\0';
  in_RDI[0x1b3] = '\0';
  in_RDI[0x1b4] = '\0';
  in_RDI[0x1b5] = '\0';
  in_RDI[0x1b6] = '\0';
  in_RDI[0x1b7] = '\0';
  MaybeCheckNotHeld((Mutex *)this_01);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RSI,(AnnotatedMixin<std::mutex> *)mutexIn,pszName,in_RDI,
             (int)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
  Reset(in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

V1Transport::V1Transport(const NodeId node_id) noexcept
    : m_magic_bytes{Params().MessageStart()}, m_node_id{node_id}
{
    LOCK(m_recv_mutex);
    Reset();
}